

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void __thiscall ELLIPSOID::ELLIPSOID(ELLIPSOID *this,double a_,double b_)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  this->a = a_;
  this->b = b_;
  auVar2._0_8_ = a_ * a_;
  auVar2._8_8_ = b_ * b_;
  auVar1._0_8_ = a_ * a_ + -b_ * b_;
  auVar1._8_8_ = a_ * a_ + -auVar2._8_8_;
  auVar1 = divpd(auVar1,auVar2);
  auVar3._8_8_ = a_ - b_;
  auVar3._0_8_ = auVar2._0_8_;
  auVar4._8_8_ = a_;
  auVar4._0_8_ = b_;
  auVar4 = divpd(auVar3,auVar4);
  this->c = (double)auVar4._0_8_;
  this->alpha = (double)auVar4._8_8_;
  this->e2 = (double)auVar1._0_8_;
  this->e1_2 = (double)auVar1._8_8_;
  this->gama_a = 9.7803267715;
  this->gama_b = 9.8321863685;
  this->GM = 398600500000000.0;
  return;
}

Assistant:

ELLIPSOID::ELLIPSOID(double a_, double b_)
{
    this->a = a_;
    this->b = b_;
    this->c = this->a * this->a / this->b;
    this->alpha = (this->a - this->b) / this->a;
    this->e2 = (this->a * this->a - this->b * this->b) / (this->a * this->a);
    this->e1_2 = (this->a * this->a - this->b * this->b) / (this->b * this->b);
    this->gama_a = gama_a_grs;
    this->gama_b = gama_b_grs;
    this->GM = GM_grs;
}